

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

AstNode * new_symbol_reference(ParserState *parser,StringObject *varname)

{
  C_MemoryAllocator *pCVar1;
  Scope *pSVar2;
  LuaSymbol *symbol;
  LuaSymbol *pLVar3;
  AstNode *pAVar4;
  AstNode *current_function;
  _Bool is_local;
  _Bool is_local_1;
  
  is_local = false;
  symbol = search_for_variable(parser,varname,&is_local);
  if (symbol == (LuaSymbol *)0x0) {
    pCVar1 = parser->compiler_state->allocator;
    symbol = (LuaSymbol *)(*pCVar1->calloc)(pCVar1->arena,1,0x48);
    symbol->symbol_type = SYM_GLOBAL;
    (symbol->field_1).variable.var_name = varname;
    (symbol->field_1).variable.block = (Scope *)0x0;
    (symbol->field_1).variable.value_type.type_code = RAVI_TANY;
    (symbol->field_1).label.block = (Scope *)0x0;
    add_upvalue_for_ENV(parser);
    pLVar3 = search_for_variable(parser,parser->compiler_state->_ENV,&is_local_1);
    (symbol->field_1).variable.env = pLVar3;
    if (pLVar3 == (LuaSymbol *)0x0) {
      __assert_fail("global->variable.env",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/parser.c"
                    ,0x1d4,"AstNode *new_symbol_reference(ParserState *, const StringObject *)");
    }
    goto LAB_00110804;
  }
  if (symbol->symbol_type == SYM_LOCAL && is_local == false) {
    current_function = parser->current_function;
    pAVar4 = ((symbol->field_1).variable.block)->function;
  }
  else {
    if (symbol->symbol_type != SYM_UPVALUE) goto LAB_00110804;
    pAVar4 = (symbol->field_1).upvalue.target_variable_function;
    current_function = parser->current_function;
    if (pAVar4 == current_function) goto LAB_00110804;
    symbol = (symbol->field_1).upvalue.target_variable;
  }
  add_upvalue_in_levels_upto(parser,current_function,pAVar4,symbol);
  symbol = search_upvalue_in_function(parser->current_function,varname);
LAB_00110804:
  pAVar4 = allocate_expr_ast_node(parser,EXPR_SYMBOL);
  pSVar2 = (symbol->field_1).label.block;
  (pAVar4->field_2).return_stmt.expr_list = (AstNodeList *)(symbol->field_1).label.label_name;
  (pAVar4->field_2).goto_stmt.name = (StringObject *)pSVar2;
  (pAVar4->field_2).symbol_expr.var = symbol;
  return pAVar4;
}

Assistant:

static AstNode *new_symbol_reference(ParserState *parser, const StringObject *varname)
{
	bool is_local = false;
	LuaSymbol *symbol = search_for_variable(parser, varname, &is_local); // Search in all scopes
	if (symbol) {
		// TODO we had a bug here - see t013.lua
		// Need more test cases for this
		// we found a local or upvalue
		if (!is_local && symbol->symbol_type == SYM_LOCAL) {
			// If the local symbol occurred in a parent function then we
			// need to construct an upvalue. Lua requires that the upvalue be
			// added to all functions in the tree up to the function where the local
			// is defined.
			add_upvalue_in_levels_upto(parser, parser->current_function, symbol->variable.block->function,
						   symbol);
			// TODO Following search could be avoided if above returned the symbol
			symbol = search_upvalue_in_function(parser->current_function, varname);
		} else if (symbol->symbol_type == SYM_UPVALUE &&
			   symbol->upvalue.target_variable_function != parser->current_function) {
			// We found an upvalue but it is not at the same level
			// Ensure all levels have the upvalue
			// Note that if the uvalue refers to special _ENV symbol then target function will be NULL
			add_upvalue_in_levels_upto(parser, parser->current_function, symbol->upvalue.target_variable_function,
						   symbol->upvalue.target_variable);
			// TODO Following search could be avoided if above returned the symbol
			symbol = search_upvalue_in_function(parser->current_function, varname);
		}
	} else {
		// Return global symbol
		CompilerState *compiler_state = parser->compiler_state;
		LuaSymbol *global = (LuaSymbol * ) compiler_state->allocator->calloc(compiler_state->allocator->arena, 1, sizeof(LuaSymbol));
		global->symbol_type = SYM_GLOBAL;
		global->variable.var_name = varname;
		global->variable.block = NULL;
		set_type(&global->variable.value_type, RAVI_TANY); // Globals are always ANY type
		// We don't add globals to any scope so that they are
		// always looked up
		symbol = global;
		// Since we have a global reference we need to add upvalue for _ENV
		// At the parser level we do not try to model that the global reference will be
		// resolved by _ENV[name] - we leave that to the code generator to decide.
		// However adding an upvalue later is hard so we do it here.
		add_upvalue_for_ENV(parser);
		bool is_local;
		global->variable.env = search_for_variable(parser, parser->compiler_state->_ENV, &is_local);
		assert(global->variable.env);
	}
	AstNode *symbol_expr = allocate_expr_ast_node(parser, EXPR_SYMBOL);
	symbol_expr->symbol_expr.type = symbol->variable.value_type;
	symbol_expr->symbol_expr.var = symbol;
	return symbol_expr;
}